

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_ransac.cpp
# Opt level: O2

int runRansac(vector<Point2D,_std::allocator<Point2D>_> *dataSets,int n,int maxIterations,
             double sigma,int d,LineModel *best_model,
             set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
             *inlier_sets,double *best_error)

{
  unsigned_long *puVar1;
  pointer pPVar2;
  double *pdVar3;
  double dVar4;
  result_type rVar5;
  ulong uVar6;
  long lVar7;
  double dVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  ulong uVar12;
  size_type __n;
  size_t j;
  size_type sVar13;
  bool bVar14;
  allocator_type local_1a1;
  double local_1a0;
  double local_198;
  double local_190;
  double local_188;
  int local_17c;
  double local_178;
  uniform_int_distribution<int> dist;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> consensus_set;
  vector<unsigned_long,_std::allocator<unsigned_long>_> availableIndices;
  vector<Point2D,_std::allocator<Point2D>_> pts;
  default_random_engine rng;
  vector<unsigned_long,_std::allocator<unsigned_long>_> allIndices;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  minSets;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> maxInliers_set;
  LineModel currentModel;
  set<int,_std::less<int>,_std::allocator<int>_> maybe_inliers;
  
  maybe_inliers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &maybe_inliers._M_t._M_impl.super__Rb_tree_header._M_header;
  maybe_inliers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  maybe_inliers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  maybe_inliers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  maxInliers_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &maxInliers_set._M_t._M_impl.super__Rb_tree_header._M_header;
  maxInliers_set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  maxInliers_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  maxInliers_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar12 = (ulong)((long)(dataSets->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(dataSets->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
                        super__Vector_impl_data._M_start) >> 4;
  *best_error = 1.79769313486232e+308;
  dVar10 = 0.0;
  local_198 = sigma;
  local_17c = d;
  maxInliers_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       maxInliers_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  maybe_inliers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       maybe_inliers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  uVar6 = time((time_t *)0x0);
  rng._M_x = uVar6 % 0x7fffffff + (ulong)(uVar6 % 0x7fffffff == 0);
  iVar9 = (int)uVar12;
  dist._M_param._M_b = iVar9 + -1;
  dist._M_param._M_a = 0;
  allIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  allIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  allIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&allIndices,(long)iVar9);
  availableIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  availableIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  availableIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_190 = (double)(uVar12 & 0xffffffff);
  if (iVar9 < 1) {
    local_190 = dVar10;
  }
  for (; local_190 != dVar10; dVar10 = (double)((long)dVar10 + 1)) {
    consensus_set._M_t._M_impl._0_8_ = dVar10;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (&allIndices,(unsigned_long *)&consensus_set);
  }
  __n = (size_type)n;
  pts.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&consensus_set,__n,
             (value_type *)&pts,(allocator_type *)&local_178);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&minSets,(long)maxIterations,(value_type *)&consensus_set,&local_1a1);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&consensus_set);
  local_1a0 = 0.0;
  local_188 = (double)(ulong)(uint)maxIterations;
  if (maxIterations < 1) {
    local_188 = local_1a0;
  }
  for (; local_1a0 != local_188; local_1a0 = (double)((long)local_1a0 + 1)) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&availableIndices,&allIndices);
    dVar10 = local_1a0;
    for (sVar13 = 0; __n != sVar13; sVar13 = sVar13 + 1) {
      rVar5 = std::uniform_int_distribution<int>::operator()(&dist,&rng);
      minSets.
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[(long)dVar10].
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[sVar13] =
           (long)(int)availableIndices.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start[rVar5];
      puVar1 = availableIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish + -1;
      availableIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           availableIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish + -1;
      availableIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[rVar5] = *puVar1;
    }
  }
  pts.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  pts.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pts.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Point2D,_std::allocator<Point2D>_>::reserve(&pts,__n);
  local_198 = local_198 * 3.841 * local_198;
  dVar10 = SQRT(local_198);
  for (dVar8 = 0.0; dVar8 != local_188; dVar8 = (double)((long)dVar8 + 1)) {
    lVar7 = 0;
    sVar13 = __n;
    while (bVar14 = sVar13 != 0, sVar13 = sVar13 - 1, bVar14) {
      pPVar2 = (dataSets->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
               super__Vector_impl_data._M_start +
               *(int *)((long)minSets.
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar7);
      dVar11 = pPVar2->y;
      pdVar3 = (double *)
               ((long)&(pts.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                        super__Vector_impl_data._M_start)->x + lVar7 * 2);
      *pdVar3 = pPVar2->x;
      pdVar3[1] = dVar11;
      lVar7 = lVar7 + 8;
    }
    LineModel::FindLineModel
              (&currentModel,
               pts.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
               super__Vector_impl_data._M_start,
               pts.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
               super__Vector_impl_data._M_start + 1);
    consensus_set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    consensus_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    consensus_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &consensus_set._M_t._M_impl.super__Rb_tree_header._M_header;
    consensus_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1a0 = dVar10;
    consensus_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         consensus_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (local_198 < 0.0) {
      local_1a0 = sqrt(local_198);
    }
    lVar7 = 0;
    for (dVar11 = 0.0; local_190 != dVar11; dVar11 = (double)((long)dVar11 + 1)) {
      dVar4 = LineModel::computeDistance
                        (&currentModel,
                         (Point2D *)
                         ((long)&((dataSets->super__Vector_base<Point2D,_std::allocator<Point2D>_>).
                                  _M_impl.super__Vector_impl_data._M_start)->x + lVar7));
      if (dVar4 < local_1a0) {
        local_178 = dVar11;
        std::
        _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
        ::_M_insert_unique<unsigned_long>(&consensus_set._M_t,(unsigned_long *)&local_178);
      }
      lVar7 = lVar7 + 0x10;
    }
    if (maxInliers_set._M_t._M_impl.super__Rb_tree_header._M_node_count <
        consensus_set._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operator=(&maxInliers_set._M_t,&consensus_set._M_t);
    }
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree(&consensus_set._M_t);
  }
  iVar9 = 0;
  if ((ulong)(long)local_17c < maxInliers_set._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    dVar10 = LineModel::estimateModel(best_model,dataSets,&maxInliers_set);
    if (*best_error <= dVar10 && dVar10 != *best_error) {
      best_model->C_ = currentModel.C_;
      best_model->A_ = currentModel.A_;
      best_model->B_ = currentModel.B_;
      local_190 = dVar10;
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operator=(&inlier_sets->_M_t,&maxInliers_set._M_t);
      *best_error = local_190;
      iVar9 = 1;
    }
  }
  std::_Vector_base<Point2D,_std::allocator<Point2D>_>::~_Vector_base
            (&pts.super__Vector_base<Point2D,_std::allocator<Point2D>_>);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&minSets);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&availableIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&allIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&maxInliers_set._M_t);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&maybe_inliers._M_t);
  return iVar9;
}

Assistant:

int runRansac(vector<Point2D>& dataSets, int n, int maxIterations, double sigma,int d,
		LineModel& best_model, set<size_t>& inlier_sets, double& best_error) {


		int isFound = 0;           //算法成功的标志
		int N = dataSets.size();
		set<int> maybe_inliers;    //初始随机选取的点（的索引值）
		LineModel currentModel;
		set<size_t> maxInliers_set;  //最大内点集
		best_error = 1.7976931348623158e+308;
		default_random_engine rng(time(NULL));     //随机数生成器
		uniform_int_distribution<int> dist(0, N - 1);  //采用均匀分布



	     //1. 新建一个容器allIndices，生成0到N-1的数作为点的索引
		vector<size_t> allIndices;
		allIndices.reserve(N);
		vector<size_t> availableIndices;

		for (int i = 0; i < N; i++)
		{
			allIndices.push_back(i);
		}


	     //2.这个点集是用来计算线性模型的所需的最小点集
		vector< vector<size_t> > minSets = vector< vector<size_t> >(maxIterations, vector<size_t>(n, 0));
		//随机选点，注意避免重复选取同一个点
		for (int it = 0; it < maxIterations; it++)
		{
			availableIndices = allIndices;
			for (size_t j = 0; j < n; j++)
			{
				// 产生0到N-1的随机数
				int randi = dist(rng);
				// idx表示哪一个索引对应的点被选中
				int idx = availableIndices[randi];

				minSets[it][j] = idx;
				//cout << "idx:" << idx << endl;
				// randi对应的索引已经被选过了，从容器中删除
				// randi对应的索引用最后一个元素替换，并删掉最后一个元素
				availableIndices[randi] = availableIndices.back();
				availableIndices.pop_back();
			}
		}


		//3.主循环程序，求解最大的一致点集
		vector<Point2D> pts;
		pts.reserve(n);
		for (int it = 0; it < maxIterations; it++)
		{

			for (size_t j = 0; j < n; j++)
			{
				int idx = minSets[it][j];

				pts[j] = dataSets[idx];

			}

			//cout << pts[0].x << endl << pts[1].x << endl;
			//根据随机到的两个点计算直线的模型
			currentModel.FindLineModel(pts[0],pts[1]);  

			//currentModel.printLineParam();
			set<size_t> consensus_set;        //选取模型后，根据误差阈值t选取的内点(的索引值)

			//根据初始模型和阈值t选择内点  
			// 基于卡方检验计算出的阈值
			const double th =sqrt(3.841*sigma*sigma);
			double current_distance_error = 0.0 ;
			double distance_error = 0.0;
			for (int i = 0; i < N; i++) 
			{
				current_distance_error= currentModel.computeDistance(dataSets[i]);
				if (current_distance_error < th) {
					consensus_set.insert(i);
				}

			}

			if (consensus_set.size() > maxInliers_set.size()) {
				maxInliers_set = consensus_set;
			}
		}

		//4.根据全部的内点重新计算模型
	        //重新在内点集上找一个误差最小的模型
		if (maxInliers_set.size() > d) {
			double current_distance_error = best_model.estimateModel(dataSets, maxInliers_set);
			//若当前模型更好，则更新输出量
			if (best_error < current_distance_error) {
				best_model = currentModel;
				inlier_sets = maxInliers_set;
				best_error = current_distance_error;
				isFound = 1;
			}
		}
		return isFound;
	}